

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::createNodeTree(OpenGEXImporter *this,aiScene *pScene)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  aiNode **ppaVar5;
  iterator __first;
  iterator __last;
  aiScene *pScene_local;
  OpenGEXImporter *this_local;
  
  if ((this->m_root != (ChildInfo *)0x0) &&
     (bVar2 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::empty
                        (&this->m_root->m_children), !bVar2)) {
    sVar3 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::size(&this->m_root->m_children)
    ;
    pScene->mRootNode->mNumChildren = (uint)sVar3;
    auVar1 = ZEXT416(pScene->mRootNode->mNumChildren) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiNode **)operator_new__(uVar4);
    pScene->mRootNode->mChildren = ppaVar5;
    __first = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::begin
                        (&this->m_root->m_children);
    __last = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::end(&this->m_root->m_children)
    ;
    std::copy<std::_List_iterator<aiNode*>,aiNode**>
              ((_List_iterator<aiNode_*>)__first._M_node,(_List_iterator<aiNode_*>)__last._M_node,
               pScene->mRootNode->mChildren);
  }
  return;
}

Assistant:

void OpenGEXImporter::createNodeTree( aiScene *pScene ) {
    if( nullptr == m_root ) {
        return;
    }

    if( m_root->m_children.empty() ) {
        return;
    }

    pScene->mRootNode->mNumChildren = static_cast<unsigned int>(m_root->m_children.size());
    pScene->mRootNode->mChildren = new aiNode*[ pScene->mRootNode->mNumChildren ];
    std::copy( m_root->m_children.begin(), m_root->m_children.end(), pScene->mRootNode->mChildren );
}